

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O3

void av1_lowbd_fwd_txfm2d_8x8_sse2(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  short *psVar1;
  int *piVar2;
  byte bVar3;
  code *pcVar4;
  code *pcVar5;
  undefined8 uVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  bool bVar15;
  undefined1 auVar16 [12];
  int8_t *piVar17;
  uint uVar18;
  uint uVar19;
  undefined7 in_register_00000009;
  long lVar20;
  undefined8 *puVar21;
  undefined8 *puVar22;
  undefined4 uVar23;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined4 uVar28;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar30 [16];
  undefined8 extraout_XMM1_Qb;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined4 uVar46;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar54 [16];
  undefined4 uVar55;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  __m128i buf0 [8];
  __m128i buf1 [8];
  undefined8 auStack_148 [2];
  undefined8 local_138 [2];
  undefined2 local_128;
  undefined2 uStack_126;
  undefined2 uStack_124;
  undefined2 uStack_122;
  undefined2 uStack_120;
  undefined2 uStack_11e;
  undefined2 uStack_11c;
  undefined2 uStack_11a;
  undefined1 local_118 [16];
  undefined2 local_108;
  undefined2 uStack_106;
  undefined2 uStack_104;
  undefined2 uStack_102;
  undefined2 uStack_100;
  undefined2 uStack_fe;
  undefined2 uStack_fc;
  undefined2 uStack_fa;
  undefined1 local_f8 [16];
  undefined2 local_e8;
  undefined2 uStack_e6;
  undefined2 uStack_e4;
  undefined2 uStack_e2;
  undefined2 uStack_e0;
  undefined2 uStack_de;
  undefined2 uStack_dc;
  undefined2 uStack_da;
  undefined1 local_d8 [16];
  undefined2 local_c8;
  undefined2 uStack_c6;
  undefined2 uStack_c4;
  undefined2 uStack_c2;
  undefined2 uStack_c0;
  undefined2 uStack_be;
  undefined2 uStack_bc;
  undefined2 uStack_ba;
  undefined8 local_b8 [5];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined1 auVar24 [12];
  undefined1 auVar25 [16];
  undefined1 auVar29 [12];
  undefined1 auVar34 [16];
  undefined1 auVar31 [16];
  undefined1 auVar35 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [12];
  undefined1 auVar48 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar56 [12];
  undefined1 auVar57 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  
  piVar17 = av1_fwd_txfm_shift_ls[1];
  puVar22 = local_138;
  uVar19 = (uint)CONCAT71(in_register_00000009,tx_type);
  bVar15 = false;
  if (uVar19 < 0x10) {
    if ((0x4110U >> (uVar19 & 0x1f) & 1) != 0) {
LAB_004bbe14:
      lVar20 = 0x80;
      do {
        uVar6 = *(undefined8 *)(input + 4);
        *(undefined8 *)((long)auStack_148 + lVar20) = *(undefined8 *)input;
        *(undefined8 *)((long)auStack_148 + lVar20 + 8) = uVar6;
        input = input + stride;
        lVar20 = lVar20 + -0x10;
      } while (lVar20 != 0);
      goto LAB_004bbe32;
    }
    if ((0x80a0U >> (uVar19 & 0x1f) & 1) == 0) {
      if (uVar19 == 6) {
        bVar15 = true;
        goto LAB_004bbe14;
      }
    }
    else {
      bVar15 = true;
    }
  }
  lVar20 = 0;
  do {
    uVar6 = *(undefined8 *)(input + 4);
    *(undefined8 *)((long)local_138 + lVar20) = *(undefined8 *)input;
    *(undefined8 *)((long)local_138 + lVar20 + 8) = uVar6;
    lVar20 = lVar20 + 0x10;
    input = input + stride;
  } while (lVar20 != 0x80);
LAB_004bbe32:
  pcVar4 = *(code **)((long)col_txfm8x8_arr + (ulong)(uVar19 * 8));
  bVar3 = *av1_fwd_txfm_shift_ls[1];
  uVar18 = (uint)(char)bVar3;
  if ((int)uVar18 < 0) {
    auVar30 = ZEXT416((uint)(1 << (~bVar3 & 0x1f)));
    auVar30 = pshuflw(auVar30,auVar30,0);
    auVar30._4_4_ = auVar30._0_4_;
    auVar30._8_4_ = auVar30._0_4_;
    auVar30._12_4_ = auVar30._0_4_;
    lVar20 = 0;
    do {
      auVar36 = paddsw(*(undefined1 (*) [16])((long)local_138 + lVar20),auVar30);
      auVar36 = psraw(auVar36,ZEXT416(-uVar18));
      *(undefined1 (*) [16])((long)local_138 + lVar20) = auVar36;
      lVar20 = lVar20 + 0x10;
    } while (lVar20 != 0x80);
  }
  else if (bVar3 != 0) {
    lVar20 = 0;
    do {
      auVar30 = psllw(*(undefined1 (*) [16])((long)local_138 + lVar20),ZEXT416(uVar18));
      *(undefined1 (*) [16])((long)local_138 + lVar20) = auVar30;
      lVar20 = lVar20 + 0x10;
    } while (lVar20 != 0x80);
  }
  pcVar5 = *(code **)((long)row_txfm8x8_arr + (ulong)(uVar19 * 8));
  auStack_148[1] = 0x4bbecc;
  (*pcVar4)(local_138,local_138,0xd);
  bVar3 = piVar17[1];
  uVar19 = (uint)(char)bVar3;
  if ((int)uVar19 < 0) {
    auVar30 = ZEXT416((uint)(1 << (~bVar3 & 0x1f)));
    auVar30 = pshuflw(auVar30,auVar30,0);
    auVar36._0_4_ = auVar30._0_4_;
    auVar36._4_4_ = auVar36._0_4_;
    auVar36._8_4_ = auVar36._0_4_;
    auVar36._12_4_ = auVar36._0_4_;
    lVar20 = 0;
    do {
      auVar30 = paddsw(*(undefined1 (*) [16])((long)local_138 + lVar20),auVar36);
      auVar30 = psraw(auVar30,ZEXT416(-uVar19));
      *(undefined1 (*) [16])((long)local_138 + lVar20) = auVar30;
      lVar20 = lVar20 + 0x10;
    } while (lVar20 != 0x80);
  }
  else if (bVar3 != 0) {
    lVar20 = 0;
    do {
      auVar30 = psllw(*(undefined1 (*) [16])((long)local_138 + lVar20),ZEXT416(uVar19));
      *(undefined1 (*) [16])((long)local_138 + lVar20) = auVar30;
      lVar20 = lVar20 + 0x10;
    } while (lVar20 != 0x80);
  }
  auVar40._0_12_ = local_138._0_12_;
  auVar40._12_2_ = local_138[0]._6_2_;
  auVar40._14_2_ = uStack_122;
  auVar39._12_4_ = auVar40._12_4_;
  auVar39._0_10_ = local_138._0_10_;
  auVar39._10_2_ = uStack_124;
  auVar38._10_6_ = auVar39._10_6_;
  auVar38._0_8_ = local_138[0];
  auVar38._8_2_ = local_138[0]._4_2_;
  auVar11._4_8_ = auVar38._8_8_;
  auVar11._2_2_ = uStack_126;
  auVar11._0_2_ = local_138[0]._2_2_;
  auVar37._0_4_ = CONCAT22(local_128,(short)local_138[0]);
  auVar37._4_12_ = auVar11;
  auVar53._0_12_ = local_118._0_12_;
  auVar53._12_2_ = local_118._6_2_;
  auVar53._14_2_ = uStack_102;
  auVar52._12_4_ = auVar53._12_4_;
  auVar52._0_10_ = local_118._0_10_;
  auVar52._10_2_ = uStack_104;
  auVar51._10_6_ = auVar52._10_6_;
  auVar51._0_8_ = local_118._0_8_;
  auVar51._8_2_ = local_118._4_2_;
  auVar12._4_8_ = auVar51._8_8_;
  auVar12._2_2_ = uStack_106;
  auVar12._0_2_ = local_118._2_2_;
  auVar45._0_12_ = local_f8._0_12_;
  auVar45._12_2_ = local_f8._6_2_;
  auVar45._14_2_ = uStack_e2;
  auVar44._12_4_ = auVar45._12_4_;
  auVar44._0_10_ = local_f8._0_10_;
  auVar44._10_2_ = uStack_e4;
  auVar43._10_6_ = auVar44._10_6_;
  auVar43._0_8_ = local_f8._0_8_;
  auVar43._8_2_ = local_f8._4_2_;
  auVar13._4_8_ = auVar43._8_8_;
  auVar13._2_2_ = uStack_e6;
  auVar13._0_2_ = local_f8._2_2_;
  auVar42._0_4_ = CONCAT22(local_e8,local_f8._0_2_);
  auVar42._4_12_ = auVar13;
  auVar61._0_12_ = local_d8._0_12_;
  auVar61._12_2_ = local_d8._6_2_;
  auVar61._14_2_ = uStack_c2;
  auVar60._12_4_ = auVar61._12_4_;
  auVar60._0_10_ = local_d8._0_10_;
  auVar60._10_2_ = uStack_c4;
  auVar59._10_6_ = auVar60._10_6_;
  auVar59._0_8_ = local_d8._0_8_;
  auVar59._8_2_ = local_d8._4_2_;
  auVar14._4_8_ = auVar59._8_8_;
  auVar14._2_2_ = uStack_c6;
  auVar14._0_2_ = local_d8._2_2_;
  uVar23 = CONCAT22(uStack_120,(short)local_138[1]);
  auVar24._0_8_ = CONCAT26(uStack_11e,CONCAT24(local_138[1]._2_2_,uVar23));
  auVar24._8_2_ = local_138[1]._4_2_;
  auVar24._10_2_ = uStack_11c;
  auVar25._12_2_ = local_138[1]._6_2_;
  auVar25._0_12_ = auVar24;
  auVar25._14_2_ = uStack_11a;
  uVar46 = CONCAT22(uStack_100,local_118._8_2_);
  auVar47._0_8_ = CONCAT26(uStack_fe,CONCAT24(local_118._10_2_,uVar46));
  auVar47._8_2_ = local_118._12_2_;
  auVar47._10_2_ = uStack_fc;
  auVar48._12_2_ = local_118._14_2_;
  auVar48._0_12_ = auVar47;
  auVar48._14_2_ = uStack_fa;
  uVar28 = CONCAT22(uStack_e0,local_f8._8_2_);
  auVar29._0_8_ = CONCAT26(uStack_de,CONCAT24(local_f8._10_2_,uVar28));
  auVar29._8_2_ = local_f8._12_2_;
  auVar29._10_2_ = uStack_dc;
  auVar31._12_2_ = local_f8._14_2_;
  auVar31._0_12_ = auVar29;
  auVar31._14_2_ = uStack_da;
  uVar55 = CONCAT22(uStack_c0,local_d8._8_2_);
  auVar56._0_8_ = CONCAT26(uStack_be,CONCAT24(local_d8._10_2_,uVar55));
  auVar56._8_2_ = local_d8._12_2_;
  auVar56._10_2_ = uStack_bc;
  auVar57._12_2_ = local_d8._14_2_;
  auVar57._0_12_ = auVar56;
  auVar57._14_2_ = uStack_ba;
  auVar49._0_8_ = auVar37._0_8_;
  auVar49._8_4_ = auVar11._0_4_;
  auVar49._12_4_ = auVar12._0_4_;
  auVar50._0_8_ = auVar42._0_8_;
  auVar50._8_4_ = auVar13._0_4_;
  auVar50._12_4_ = auVar14._0_4_;
  auVar54._8_4_ = (int)((ulong)auVar24._0_8_ >> 0x20);
  auVar54._0_8_ = auVar24._0_8_;
  auVar54._12_4_ = (int)((ulong)auVar47._0_8_ >> 0x20);
  auVar58._8_4_ = (int)((ulong)auVar29._0_8_ >> 0x20);
  auVar58._0_8_ = auVar29._0_8_;
  auVar58._12_4_ = (int)((ulong)auVar56._0_8_ >> 0x20);
  auVar41._0_8_ = CONCAT44(auVar51._8_4_,auVar38._8_4_);
  auVar41._8_4_ = auVar39._12_4_;
  auVar41._12_4_ = auVar52._12_4_;
  auVar26._0_8_ = CONCAT44(auVar47._8_4_,auVar24._8_4_);
  auVar26._8_4_ = auVar25._12_4_;
  auVar26._12_4_ = auVar48._12_4_;
  local_b8[0] = CONCAT44(CONCAT22(local_108,local_118._0_2_),auVar37._0_4_);
  local_b8[1] = CONCAT44(CONCAT22(local_c8,local_d8._0_2_),auVar42._0_4_);
  local_b8[2] = auVar49._8_8_;
  local_b8[3] = auVar50._8_8_;
  local_b8[4] = auVar41._0_8_;
  uStack_90 = auVar43._8_4_;
  uStack_8c = auVar59._8_4_;
  local_88 = auVar41._8_8_;
  local_78 = CONCAT44(uVar46,uVar23);
  uStack_70 = CONCAT44(uVar55,uVar28);
  local_68 = auVar54._8_8_;
  uStack_60 = auVar58._8_8_;
  local_58 = auVar26._0_8_;
  uStack_50 = auVar29._8_4_;
  uStack_4c = auVar56._8_4_;
  local_48 = auVar26._8_8_;
  uStack_38 = auVar31._12_4_;
  uStack_34 = auVar57._12_4_;
  if (bVar15) {
    lVar20 = 0x80;
    puVar21 = local_b8;
    do {
      uVar6 = puVar21[1];
      *(undefined8 *)((long)auStack_148 + lVar20) = *puVar21;
      *(undefined8 *)((long)auStack_148 + lVar20 + 8) = uVar6;
      puVar21 = puVar21 + 2;
      lVar20 = lVar20 + -0x10;
    } while (lVar20 != 0);
  }
  else {
    puVar22 = local_b8;
  }
  auStack_148[1] = 0x4bc093;
  (*pcVar5)(puVar22,puVar22,0xd);
  auVar32._8_8_ = extraout_XMM1_Qb;
  auVar32._0_8_ = extraout_XMM1_Qa;
  bVar3 = piVar17[2];
  if ((char)bVar3 < '\0') {
    auVar30 = ZEXT416((uint)(1 << (~bVar3 & 0x1f)));
    auVar30 = pshuflw(auVar30,auVar30,0);
    auVar27._0_4_ = auVar30._0_4_;
    auVar27._4_4_ = auVar27._0_4_;
    auVar27._8_4_ = auVar27._0_4_;
    auVar27._12_4_ = auVar27._0_4_;
    lVar20 = 0;
    auVar32 = ZEXT416((uint)-(int)(char)bVar3);
    do {
      auVar30 = paddsw(*(undefined1 (*) [16])((long)puVar22 + lVar20),auVar27);
      auVar30 = psraw(auVar30,auVar32);
      *(undefined1 (*) [16])((long)puVar22 + lVar20) = auVar30;
      lVar20 = lVar20 + 0x10;
    } while (lVar20 != 0x80);
  }
  else if (bVar3 != 0) {
    lVar20 = 0;
    do {
      auVar32 = psllw(*(undefined1 (*) [16])((long)puVar22 + lVar20),ZEXT416((uint)(int)(char)bVar3)
                     );
      *(undefined1 (*) [16])((long)puVar22 + lVar20) = auVar32;
      lVar20 = lVar20 + 0x10;
    } while (lVar20 != 0x80);
  }
  lVar20 = 0;
  do {
    psVar1 = (short *)((long)puVar22 + lVar20);
    sVar7 = psVar1[4];
    sVar8 = psVar1[5];
    sVar9 = psVar1[6];
    sVar10 = psVar1[7];
    auVar35._0_12_ = auVar32._0_12_;
    auVar35._12_2_ = auVar32._6_2_;
    auVar35._14_2_ = psVar1[3];
    auVar34._12_4_ = auVar35._12_4_;
    auVar34._0_10_ = auVar32._0_10_;
    auVar34._10_2_ = psVar1[2];
    auVar33._10_6_ = auVar34._10_6_;
    auVar33._0_8_ = auVar32._0_8_;
    auVar33._8_2_ = auVar32._4_2_;
    auVar16._4_8_ = auVar33._8_8_;
    auVar16._2_2_ = psVar1[1];
    auVar16._0_2_ = auVar32._2_2_;
    auVar32._0_4_ = (int)*psVar1;
    auVar32._4_4_ = auVar16._0_4_ >> 0x10;
    auVar32._8_4_ = auVar33._8_4_ >> 0x10;
    auVar32._12_4_ = auVar34._12_4_ >> 0x10;
    *(undefined1 (*) [16])((long)output + lVar20 * 2) = auVar32;
    piVar2 = (int *)((long)output + lVar20 * 2 + 0x10);
    *piVar2 = (int)sVar7;
    piVar2[1] = (int)sVar8;
    piVar2[2] = (int)sVar9;
    piVar2[3] = (int)sVar10;
    lVar20 = lVar20 + 0x10;
  } while (lVar20 != 0x80);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_8x8_sse2(const int16_t *input, int32_t *output,
                                   int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[8], buf1[8], *buf;
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X8];
  const int txw_idx = get_txw_idx(TX_8X8);
  const int txh_idx = get_txh_idx(TX_8X8);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 8;
  const int height = 8;
  const transform_1d_sse2 col_txfm = col_txfm8x8_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm8x8_arr[tx_type];
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  if (ud_flip)
    load_buffer_16bit_to_16bit_flip(input, stride, buf0, height);
  else
    load_buffer_16bit_to_16bit(input, stride, buf0, height);
  round_shift_16bit(buf0, height, shift[0]);
  col_txfm(buf0, buf0, cos_bit_col);
  round_shift_16bit(buf0, height, shift[1]);
  transpose_16bit_8x8(buf0, buf1);

  if (lr_flip) {
    buf = buf0;
    flip_buf_sse2(buf1, buf, width);
  } else {
    buf = buf1;
  }
  row_txfm(buf, buf, cos_bit_row);
  round_shift_16bit(buf, width, shift[2]);
  store_buffer_16bit_to_32bit_w8(buf, output, height, width);
}